

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall QFutureInterfaceBase::cleanContinuation(QFutureInterfaceBase *this)

{
  __pointer_type copy;
  _Manager_type p_Var1;
  QBasicMutex *this_00;
  QFutureInterfaceBasePrivate *pQVar2;
  bool bVar3;
  
  pQVar2 = this->d;
  if (pQVar2 == (QFutureInterfaceBasePrivate *)0x0) {
    return;
  }
  this_00 = &pQVar2->continuationMutex;
  if ((pQVar2->continuationMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar3 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar3) goto LAB_003cf108;
  }
  QBasicMutex::lockInternal(this_00);
LAB_003cf108:
  pQVar2 = this->d;
  p_Var1 = (pQVar2->continuation).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&pQVar2->continuation,(_Any_data *)&pQVar2->continuation,
              __destroy_functor);
    (pQVar2->continuation).super__Function_base._M_manager = (_Manager_type)0x0;
    (pQVar2->continuation)._M_invoker = (_Invoker_type)0x0;
    pQVar2 = this->d;
  }
  LOCK();
  (pQVar2->continuationState)._M_i = Cleaned;
  UNLOCK();
  this->d->continuationData = (QFutureInterfaceBasePrivate *)0x0;
  LOCK();
  copy = (this_00->d_ptr)._q_value._M_b._M_p;
  (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy == (__pointer_type)0x1) {
    return;
  }
  QBasicMutex::unlockInternalFutex(this_00,copy);
  return;
}

Assistant:

void QFutureInterfaceBase::cleanContinuation()
{
    if (!d)
        return;

    QMutexLocker lock(&d->continuationMutex);
    d->continuation = nullptr;
    d->continuationState = QFutureInterfaceBasePrivate::Cleaned;
    d->continuationData = nullptr;
}